

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# run_container_unit.c
# Opt level: O1

void select_test(void)

{
  _Bool _Var1;
  run_container_t *run;
  uint32_t rank;
  uint16_t pos;
  uint16_t value;
  unsigned_long b;
  uint32_t element;
  uint32_t start_rank;
  undefined8 local_38;
  
  run = run_container_create();
  _assert_true((unsigned_long)run,"B",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/run_container_unit.c"
               ,0x99);
  pos = 0x16;
  do {
    pos = pos + 5;
    run_container_add(run,pos);
  } while (pos < 0xde);
  local_38 = 0;
  b = 0x1b;
  rank = 0xc;
  do {
    local_38 = CONCAT44(0xc,(uint32_t)local_38);
    _Var1 = run_container_select(run,(uint32_t *)((long)&local_38 + 4),rank,(uint32_t *)&local_38);
    _assert_true((ulong)_Var1,"run_container_select(B, &start_rank, i + 12, &element)",
                 "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/run_container_unit.c"
                 ,0xa3);
    _assert_int_equal(local_38 & 0xffffffff,b,
                      "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/run_container_unit.c"
                      ,0xa4);
    b = b + 5;
    rank = rank + 1;
  } while (rank != 0x34);
  local_38._4_4_ = 0xc;
  _Var1 = run_container_select(run,(uint32_t *)((long)&local_38 + 4),0x34,(uint32_t *)&local_38);
  _assert_true((ulong)!_Var1,"run_container_select(B, &start_rank, i + 12, &element)",
               "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/run_container_unit.c"
               ,0xa8);
  _assert_int_equal((ulong)local_38._4_4_,0x34,
                    "/workspace/llm4binary/github/license_c_cmakelists/RoaringBitmap[P]CRoaring/tests/run_container_unit.c"
                    ,0xa9);
  run_container_free(run);
  return;
}

Assistant:

DEFINE_TEST(select_test) {
    run_container_t* B = run_container_create();
    assert_non_null(B);
    uint16_t base = 27;
    for (uint16_t value = base; value < base + 200; value += 5) {
        run_container_add(B, value);
    }
    uint32_t i = 0;
    uint32_t element = 0;
    uint32_t start_rank;
    for (uint16_t value = base; value < base + 200; value += 5) {
        start_rank = 12;
        assert_true(run_container_select(B, &start_rank, i + 12, &element));
        assert_int_equal(element, value);
        i++;
    }
    start_rank = 12;
    assert_false(run_container_select(B, &start_rank, i + 12, &element));
    assert_int_equal(start_rank, i + 12);
    run_container_free(B);
}